

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_mesh * rf_gen_mesh_heightmap
                    (rf_mesh *__return_storage_ptr__,rf_image heightmap,rf_vec3 size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  undefined1 auVar1 [16];
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_allocator_args rVar7;
  rf_allocator_args rVar8;
  rf_allocator allocator_00;
  rf_image image;
  undefined1 auVar9 [24];
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  int iVar12;
  uint *puVar13;
  rf_color *prVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  rf_allocator_proc *prVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  float *pfVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar48;
  undefined1 auVar47 [16];
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  rf_allocator_proc *in_stack_fffffffffffffea0;
  rf_allocator local_140;
  rf_color *local_130;
  undefined8 uStack_128;
  undefined4 local_120;
  uint uStack_11c;
  char *local_118;
  char *pcStack_110;
  undefined8 local_108;
  undefined8 local_100;
  long lStack_f8;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  uint uStack_bc;
  uint uStack_8c;
  uint uStack_5c;
  rf_allocator local_40;
  
  local_140.user_data = temp_allocator.user_data;
  local_40.allocator_proc = allocator.allocator_proc;
  local_40.user_data = allocator.user_data;
  auVar47._8_4_ = in_XMM0_Dc;
  auVar47._0_8_ = size._0_8_;
  auVar47._12_4_ = in_XMM0_Dd;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  lVar34 = 0;
  rVar2.proc_name = "rf_gen_mesh_heightmap";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x891d;
  rVar7._16_8_ = (ulong)uStack_5c << 0x20;
  rVar7.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar7.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  local_140.allocator_proc = temp_allocator.allocator_proc;
  puVar13 = (uint *)(*local_40.allocator_proc)(&local_40,rVar2,RF_AM_ALLOC,rVar7);
  __return_storage_ptr__->vbo_id = puVar13;
  puVar13[0] = 0;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar13[3] = 0;
  puVar13[3] = 0;
  puVar13[4] = 0;
  puVar13[5] = 0;
  puVar13[6] = 0;
  lVar37 = (long)heightmap.width;
  image.data._4_4_ = in_stack_ffffffffffffff14;
  image.data._0_4_ = in_stack_ffffffffffffff10;
  image.width = (int)in_stack_ffffffffffffff18;
  image.height = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  image.format = (int)in_stack_ffffffffffffff20;
  image.valid = (_Bool)(char)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  image._21_3_ = (int3)((ulong)in_stack_ffffffffffffff20 >> 0x28);
  allocator_00.user_data._4_4_ = in_stack_fffffffffffffe9c;
  allocator_00.user_data._0_4_ = in_stack_fffffffffffffe98;
  allocator_00.allocator_proc = in_stack_fffffffffffffea0;
  prVar14 = rf_image_pixels_to_rgba32(image,allocator_00);
  iVar18 = heightmap.width + -1;
  iVar12 = heightmap.height + -1;
  iVar32 = iVar12 * iVar18;
  __return_storage_ptr__->triangle_count = iVar32 * 2;
  __return_storage_ptr__->vertex_count = iVar32 * 6;
  lVar36 = (long)(iVar32 * 0x12) << 2;
  rVar3.proc_name = "rf_gen_mesh_heightmap";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x892a;
  auVar9._8_8_ = (ulong)uStack_8c << 0x20;
  auVar9._0_8_ = lVar36;
  auVar9._16_8_ = 0;
  pfVar15 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar3,RF_AM_ALLOC,(rf_allocator_args)(auVar9 << 0x40));
  __return_storage_ptr__->vertices = pfVar15;
  rVar4.proc_name = "rf_gen_mesh_heightmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x892b;
  auVar10._8_8_ = (ulong)uStack_bc << 0x20;
  auVar10._0_8_ = lVar36;
  auVar10._16_8_ = 0;
  pfVar16 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar4,RF_AM_ALLOC,(rf_allocator_args)(auVar10 << 0x40));
  __return_storage_ptr__->normals = pfVar16;
  local_100 = 0;
  lStack_f8 = (long)(iVar32 * 0xc) << 2;
  rVar5.proc_name = "rf_gen_mesh_heightmap";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x892c;
  auVar11._8_8_ = (ulong)in_stack_ffffffffffffff14 << 0x20;
  auVar11._0_8_ = lStack_f8;
  auVar11._16_8_ = 0;
  pfVar17 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar5,RF_AM_ALLOC,(rf_allocator_args)(auVar11 << 0x40));
  __return_storage_ptr__->texcoords = pfVar17;
  __return_storage_ptr__->colors = (uchar *)0x0;
  prVar21 = temp_allocator.allocator_proc;
  if (1 < heightmap.height) {
    auVar1._4_4_ = 0x437f0000;
    auVar1._0_4_ = (float)(int)lVar37;
    auVar1._8_8_ = 0;
    auVar47 = divps(auVar47,auVar1);
    fVar46 = size.z / (float)heightmap.height;
    fVar48 = auVar47._4_4_;
    lVar36 = 0;
    lVar27 = 0;
    lVar28 = 0;
    do {
      if (1 < (int)lVar37) {
        lVar23 = lVar36 * lVar37;
        fVar39 = fVar46 * (float)lVar36;
        fVar40 = (float)(lVar36 + 1);
        lVar30 = (lVar36 + 1) * lVar37;
        fVar41 = fVar46 * fVar40;
        fVar38 = (float)lVar36 / (float)iVar12;
        fVar40 = fVar40 / (float)iVar12;
        lVar34 = (long)(int)lVar34;
        lVar27 = (long)(int)lVar27;
        lVar28 = (long)(int)lVar28;
        uVar24 = (uint)prVar14[lVar23].r;
        uVar33 = (uint)prVar14[lVar23].g;
        uVar22 = (uint)prVar14[lVar23].b;
        uVar25 = (uint)prVar14[lVar30].r;
        uVar26 = (uint)prVar14[lVar30].g;
        uVar35 = (uint)prVar14[lVar30].b;
        pfVar31 = pfVar16 + lVar28 + 2;
        lVar19 = 0;
        do {
          fVar42 = (float)lVar19 * auVar47._0_4_;
          *(ulong *)(pfVar15 + lVar34) =
               CONCAT44((float)((uVar22 + uVar33 + uVar24) / 3) * fVar48,fVar42);
          pfVar15[lVar34 + 2] = fVar39;
          pfVar15[lVar34 + 3] = fVar42;
          fVar43 = (float)((uVar35 + uVar26 + uVar25) / 3) * fVar48;
          pfVar15[lVar34 + 4] = fVar43;
          lVar20 = lVar19 + 1;
          pfVar15[lVar34 + 5] = fVar41;
          uVar24 = (uint)prVar14[lVar19 + lVar23 + 1].r;
          uVar33 = (uint)prVar14[lVar19 + lVar23 + 1].g;
          uVar22 = (uint)prVar14[lVar19 + lVar23 + 1].b;
          fVar44 = (float)lVar20 * auVar47._0_4_;
          fVar45 = (float)((uVar33 + uVar24 + uVar22) / 3) * fVar48;
          *(ulong *)(pfVar15 + lVar34 + 6) = CONCAT44(fVar45,fVar44);
          pfVar15[lVar34 + 8] = fVar39;
          *(ulong *)(pfVar15 + lVar34 + 9) = CONCAT44(fVar45,fVar44);
          pfVar15[lVar34 + 0xb] = fVar39;
          pfVar15[lVar34 + 0xc] = fVar42;
          pfVar15[lVar34 + 0xd] = fVar43;
          pfVar15[lVar34 + 0xe] = fVar41;
          pfVar15[lVar34 + 0xf] = fVar44;
          uVar25 = (uint)prVar14[lVar19 + lVar30 + 1].r;
          uVar26 = (uint)prVar14[lVar19 + lVar30 + 1].g;
          uVar35 = (uint)prVar14[lVar19 + lVar30 + 1].b;
          pfVar15[lVar34 + 0x10] = (float)((uVar26 + uVar25 + uVar35) / 3) * fVar48;
          pfVar15[lVar34 + 0x11] = fVar41;
          fVar42 = (float)lVar19 / (float)iVar18;
          pfVar17[lVar27] = fVar42;
          pfVar17[lVar27 + 1] = fVar38;
          pfVar17[lVar27 + 2] = fVar42;
          pfVar17[lVar27 + 3] = fVar40;
          fVar43 = (float)lVar20 / (float)iVar18;
          pfVar17[lVar27 + 4] = fVar43;
          pfVar17[lVar27 + 5] = fVar38;
          pfVar17[lVar27 + 6] = fVar43;
          pfVar17[lVar27 + 7] = fVar38;
          pfVar17[lVar27 + 8] = fVar42;
          pfVar17[lVar27 + 9] = fVar40;
          pfVar17[lVar27 + 10] = fVar43;
          pfVar17[lVar27 + 0xb] = fVar40;
          uVar29 = 0xfffffffffffffffd;
          do {
            (pfVar31 + uVar29 + 1)[0] = 0.0;
            (pfVar31 + uVar29 + 1)[1] = 1.0;
            pfVar31[uVar29 + 3] = 0.0;
            uVar29 = uVar29 + 3;
          } while (uVar29 < 0xf);
          lVar34 = lVar34 + 0x12;
          lVar27 = lVar27 + 0xc;
          lVar28 = lVar28 + 0x12;
          pfVar31 = pfVar31 + 0x12;
          lVar19 = lVar20;
        } while (lVar20 != iVar18);
      }
      lVar36 = lVar36 + 1;
      prVar21 = local_140.allocator_proc;
    } while (lVar36 != iVar12);
  }
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_110 = "rf_gen_mesh_heightmap";
  local_108 = 0x897e;
  uStack_128 = 0;
  local_120 = 0;
  rVar6.proc_name = "rf_gen_mesh_heightmap";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x897e;
  rVar8.size_to_allocate_or_reallocate = 0;
  rVar8.pointer_to_free_or_realloc = prVar14;
  rVar8._16_8_ = (ulong)uStack_11c << 0x20;
  local_130 = prVar14;
  (*prVar21)(&local_140,rVar6,RF_AM_FREE,rVar8);
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_heightmap(rf_image heightmap, rf_vec3 size, rf_allocator allocator, rf_allocator temp_allocator)
{
#define RF_GRAY_VALUE(c) ((c.r+c.g+c.b)/3)

    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    int map_x = heightmap.width;
    int map_z = heightmap.height;

    rf_color* pixels = rf_image_pixels_to_rgba32(heightmap, temp_allocator);

    // NOTE: One vertex per pixel
    mesh.triangle_count = (map_x - 1) * (map_z - 1) * 2; // One quad every four pixels

    mesh.vertex_count = mesh.triangle_count * 3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors    = NULL;

    int vertex_pos_counter      = 0; // Used to count vertices float by float
    int vertex_texcoord_counter = 0; // Used to count texcoords float by float
    int n_counter               = 0; // Used to count normals float by float
    int tris_counter            = 0;

    rf_vec3 scale_factor = { size.x / map_x, size.y / 255.0f, size.z / map_z };

    for (rf_int z = 0; z < map_z-1; z++)
    {
        for (rf_int x = 0; x < map_x-1; x++)
        {
            // Fill vertices array with data
            //----------------------------------------------------------

            // one triangle - 3 vertex
            mesh.vertices[vertex_pos_counter    ] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 1] = (float) RF_GRAY_VALUE(pixels[x + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 2] = (float) z * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 3] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 4] = (float) RF_GRAY_VALUE(pixels[x + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 5] = (float) (z + 1) * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 6] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 7] = (float)RF_GRAY_VALUE(pixels[(x + 1) + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 8] = (float)z * scale_factor.z;

            // another triangle - 3 vertex
            mesh.vertices[vertex_pos_counter + 9 ] = mesh.vertices[vertex_pos_counter + 6];
            mesh.vertices[vertex_pos_counter + 10] = mesh.vertices[vertex_pos_counter + 7];
            mesh.vertices[vertex_pos_counter + 11] = mesh.vertices[vertex_pos_counter + 8];

            mesh.vertices[vertex_pos_counter + 12] = mesh.vertices[vertex_pos_counter + 3];
            mesh.vertices[vertex_pos_counter + 13] = mesh.vertices[vertex_pos_counter + 4];
            mesh.vertices[vertex_pos_counter + 14] = mesh.vertices[vertex_pos_counter + 5];

            mesh.vertices[vertex_pos_counter + 15] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 16] = (float)RF_GRAY_VALUE(pixels[(x + 1) + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 17] = (float)(z + 1) * scale_factor.z;
            vertex_pos_counter += 18; // 6 vertex, 18 floats

            // Fill texcoords array with data
            //--------------------------------------------------------------
            mesh.texcoords[vertex_texcoord_counter    ] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 1] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 2] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 3] = (float)(z + 1) / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 4] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 5] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 6] = mesh.texcoords[vertex_texcoord_counter + 4];
            mesh.texcoords[vertex_texcoord_counter + 7] = mesh.texcoords[vertex_texcoord_counter + 5];

            mesh.texcoords[vertex_texcoord_counter + 8] = mesh.texcoords[vertex_texcoord_counter + 2];
            mesh.texcoords[vertex_texcoord_counter + 9] = mesh.texcoords[vertex_texcoord_counter + 3];

            mesh.texcoords[vertex_texcoord_counter + 10] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 11] = (float)(z + 1) / (map_z - 1);

            vertex_texcoord_counter += 12; // 6 texcoords, 12 floats

            // Fill normals array with data
            //--------------------------------------------------------------
            for (rf_int i = 0; i < 18; i += 3)
            {
                mesh.normals[n_counter + i    ] = 0.0f;
                mesh.normals[n_counter + i + 1] = 1.0f;
                mesh.normals[n_counter + i + 2] = 0.0f;
            }

            // TODO: Calculate normals in an efficient way

            n_counter    += 18; // 6 vertex, 18 floats
            tris_counter += 2;
        }
    }

    RF_FREE(temp_allocator, pixels);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}